

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimplifyGlobals.cpp
# Opt level: O2

void __thiscall
wasm::anon_unknown_163::ConstantGlobalApplier::visitFunction
          (ConstantGlobalApplier *this,Function *curr)

{
  undefined1 local_180 [8];
  PassRunner runner;
  
  if (this->replaced == true) {
    if (this->refinalize == true) {
      ReFinalize::ReFinalize((ReFinalize *)local_180);
      Walker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>::
      walkFunctionInModule
                ((Walker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_> *)
                 &runner.options.ignoreImplicitTraps,curr,*(Module **)&this->field_0x128);
      ReFinalize::~ReFinalize((ReFinalize *)local_180);
    }
    if (this->optimize == true) {
      PassRunner::PassRunner((PassRunner *)local_180,*(PassRunner **)&this->field_0x8);
      PassRunner::addDefaultFunctionOptimizationPasses((PassRunner *)local_180);
      PassRunner::runOnFunction((PassRunner *)local_180,curr);
      PassRunner::~PassRunner((PassRunner *)local_180);
    }
  }
  return;
}

Assistant:

void visitFunction(Function* curr) {
    if (replaced) {
      if (refinalize) {
        ReFinalize().walkFunctionInModule(curr, this->getModule());
      }
      if (optimize) {
        PassRunner runner(getPassRunner());
        runner.addDefaultFunctionOptimizationPasses();
        runner.runOnFunction(curr);
      }
    }
  }